

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O2

bool libaom_examples::anon_unknown_0::parse_line
               (ifstream *file,int min_indent,bool is_list,int *indent,bool *has_list_prefix,
               int *line_idx,string *field_name,ParsedValue *value,bool *syntax_error)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  _Ios_Seekdir _Var4;
  istream *piVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  char *pcVar11;
  double dVar12;
  string line;
  string value_str;
  char *endptr;
  
  std::__cxx11::string::assign((char *)field_name);
  *syntax_error = false;
  value->type_ = kNone;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iVar2 = *indent;
  do {
    _Var4 = std::istream::tellg();
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)file,(string *)&line);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
LAB_0012767f:
      bVar9 = false;
LAB_00127681:
      std::__cxx11::string::~string((string *)&line);
      return bVar9;
    }
    lVar6 = std::__cxx11::string::find((char)&line,0x23);
    if (lVar6 != -1) {
      std::__cxx11::string::resize((ulong)&line);
    }
    while( true ) {
      if ((line._M_string_length == 0) || (line._M_dataplus._M_p[line._M_string_length - 1] != ' '))
      break;
      std::__cxx11::string::resize((ulong)&line);
    }
    *indent = 0;
    *has_list_prefix = false;
    uVar10 = line._M_string_length & 0xffffffff;
    if ((int)line._M_string_length < 1) {
      uVar10 = 0;
    }
    uVar8 = 0;
    while (uVar10 != uVar8) {
      cVar1 = line._M_dataplus._M_p[uVar8];
      if ((cVar1 != '\t') && (cVar1 != ' ')) {
        if (cVar1 != '-') break;
        *has_list_prefix = true;
      }
      uVar8 = uVar8 + 1;
      *indent = (int)uVar8;
    }
    std::__cxx11::string::substr((ulong)&value_str,(ulong)&line);
    std::__cxx11::string::operator=((string *)&line,(string *)&value_str);
    std::__cxx11::string::~string((string *)&value_str);
    if (line._M_string_length != 0) {
      if ((min_indent <= *indent) && (iVar2 <= *indent || iVar2 < 1)) {
        *line_idx = *line_idx + 1;
        if ((iVar2 < 0) || (iVar2 == *indent)) {
          if (*has_list_prefix != true || is_list) {
            std::__cxx11::string::string((string *)&value_str,(string *)&line);
            lVar6 = std::__cxx11::string::find((char)&line,0x3a);
            if (lVar6 != -1) {
              std::__cxx11::string::substr((ulong)&endptr,(ulong)&line);
              std::__cxx11::string::operator=((string *)field_name,(string *)&endptr);
              std::__cxx11::string::~string((string *)&endptr);
              std::__cxx11::string::substr((ulong)&endptr,(ulong)&line);
              std::__cxx11::string::operator=((string *)&value_str,(string *)&endptr);
              std::__cxx11::string::~string((string *)&endptr);
            }
            bVar9 = true;
            if (value_str._M_string_length != 0) {
              lVar6 = std::__cxx11::string::find((char)&line,0x2e);
              if (lVar6 == -1) {
                lVar6 = strtol(value_str._M_dataplus._M_p,&endptr,10);
                value->type_ = kInteger;
                value->int_value_ = lVar6;
                if (*endptr != '\0') {
                  uVar3 = *line_idx;
                  pcVar11 = "Error: Failed to parse integer from \'%s\' at line %d\n";
                  goto LAB_00127877;
                }
              }
              else {
                dVar12 = strtod(value_str._M_dataplus._M_p,&endptr);
                value->type_ = kFloatingPoint;
                value->double_value_ = dVar12;
                if (*endptr != '\0') {
                  uVar3 = *line_idx;
                  pcVar11 = "Error: Failed to parse floating point value from \'%s\' at line %d\n";
LAB_00127877:
                  fprintf(_stderr,pcVar11,value_str._M_dataplus._M_p,(ulong)uVar3);
                  *syntax_error = true;
                  bVar9 = false;
                }
              }
            }
            std::__cxx11::string::~string((string *)&value_str);
            goto LAB_00127681;
          }
          pcVar11 = "Error: Unexpected list item at line %d\n";
        }
        else {
          pcVar11 = "Error: Bad indentation at line %d\n";
        }
        bVar9 = false;
        fprintf(_stderr,pcVar11);
        *syntax_error = true;
        goto LAB_00127681;
      }
      plVar7 = (long *)std::istream::seekg((long)file,_Var4);
      if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
        fwrite("Failed to seek to previous file position\n",0x29,1,_stderr);
        *syntax_error = true;
      }
      goto LAB_0012767f;
    }
    *line_idx = *line_idx + 1;
  } while( true );
}

Assistant:

bool parse_line(std::ifstream &file, int min_indent, bool is_list, int *indent,
                bool *has_list_prefix, int *line_idx, std::string *field_name,
                ParsedValue *value, bool *syntax_error) {
  *field_name = "";
  *syntax_error = false;
  value->Clear();
  std::string line;
  std::ifstream::pos_type prev_file_position;
  const int prev_indent = *indent;
  while (prev_file_position = file.tellg(), std::getline(file, line)) {
    cleanup_line(line);
    get_indent(line, indent, has_list_prefix);
    line = line.substr(*indent);  // skip indentation
    // If the line is indented less than 'min_indent', it belongs to the outer
    // object, and parsing should go back to the previous function in the stack.
    if (!line.empty() &&
        (*indent < min_indent || (prev_indent > 0 && *indent < prev_indent))) {
      // Undo reading the last line.
      if (!file.seekg(prev_file_position, std::ios::beg)) {
        fprintf(stderr, "Failed to seek to previous file position\n");
        *syntax_error = true;
        return false;
      }
      return false;
    }

    ++(*line_idx);
    if (line.empty()) continue;

    if (prev_indent >= 0 && prev_indent != *indent) {
      fprintf(stderr, "Error: Bad indentation at line %d\n", *line_idx);
      *syntax_error = true;
      return false;
    }
    if (*has_list_prefix && !is_list) {
      fprintf(stderr, "Error: Unexpected list item at line %d\n", *line_idx);
      *syntax_error = true;
      return false;
    }

    std::string value_str = line;
    size_t colon_pos = line.find(':');
    if (colon_pos != std::string::npos) {
      *field_name = line.substr(0, colon_pos);
      value_str = line.substr(colon_pos + 1);
    }
    if (!value_str.empty()) {
      char *endptr;
      if (line.find('.') != std::string::npos) {
        value->SetFloatingPointValue(strtod(value_str.c_str(), &endptr));
        if (*endptr != '\0') {
          fprintf(stderr,
                  "Error: Failed to parse floating point value from '%s' at "
                  "line %d\n",
                  value_str.c_str(), *line_idx);
          *syntax_error = true;
          return false;
        }
      } else {
        value->SetIntegerValue(strtol(value_str.c_str(), &endptr, 10));
        if (*endptr != '\0') {
          fprintf(stderr,
                  "Error: Failed to parse integer from '%s' at line %d\n",
                  value_str.c_str(), *line_idx);
          *syntax_error = true;
          return false;
        }
      }
    }
    return true;
  }
  return false;  // Reached the end of the file.
}